

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

int mbedtls_rsa_rsaes_pkcs1_v15_encrypt
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,size_t ilen,uchar *input,uchar *output)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uchar *__s;
  size_t __n;
  bool bVar5;
  
  if ((((mode != 1) || (iVar2 = -0x4080, ctx->padding == 0)) &&
      (iVar2 = -0x4080,
      output != (uchar *)0x0 &&
      (input != (uchar *)0x0 && f_rng != (_func_int_void_ptr_uchar_ptr_size_t *)0x0))) &&
     (uVar1 = ctx->len, ilen + 0xb <= uVar1 && ilen < 0xfffffffffffffff5)) {
    __n = (uVar1 - ilen) - 3;
    *output = '\0';
    __s = output + 2;
    if (mode != 0) {
      output[1] = '\x01';
      if (__n != 0) {
        memset(__s,0xff,__n);
        __s = output + ~ilen + uVar1;
      }
      *__s = '\0';
      memcpy(__s + 1,input,ilen);
      iVar2 = mbedtls_rsa_private(ctx,f_rng,p_rng,output,output);
      return iVar2;
    }
    output[1] = '\x02';
    do {
      bVar5 = __n == 0;
      __n = __n - 1;
      if (bVar5) {
        *__s = '\0';
        memcpy(__s + 1,input,ilen);
        iVar2 = mbedtls_rsa_public(ctx,output,output);
        return iVar2;
      }
      iVar4 = 100;
      do {
        iVar2 = (*f_rng)(p_rng,__s,1);
        iVar3 = iVar4;
        if ((*__s != '\0') || (iVar3 = iVar4 + -1, iVar4 == 1)) break;
        iVar4 = iVar3;
      } while (iVar2 == 0);
    } while ((iVar3 != 0) && (__s = __s + 1, iVar2 == 0));
    iVar2 = iVar2 + -0x4480;
  }
  return iVar2;
}

Assistant:

int mbedtls_rsa_rsaes_pkcs1_v15_encrypt( mbedtls_rsa_context *ctx,
                                 int (*f_rng)(void *, unsigned char *, size_t),
                                 void *p_rng,
                                 int mode, size_t ilen,
                                 const unsigned char *input,
                                 unsigned char *output )
{
    size_t nb_pad, olen;
    int ret;
    unsigned char *p = output;

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V15 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    // We don't check p_rng because it won't be dereferenced here
    if( f_rng == NULL || input == NULL || output == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    olen = ctx->len;

    /* first comparison checks for overflow */
    if( ilen + 11 < ilen || olen < ilen + 11 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    nb_pad = olen - 3 - ilen;

    *p++ = 0;
    if( mode == MBEDTLS_RSA_PUBLIC )
    {
        *p++ = MBEDTLS_RSA_CRYPT;

        while( nb_pad-- > 0 )
        {
            int rng_dl = 100;

            do {
                ret = f_rng( p_rng, p, 1 );
            } while( *p == 0 && --rng_dl && ret == 0 );

            /* Check if RNG failed to generate data */
            if( rng_dl == 0 || ret != 0 )
                return( MBEDTLS_ERR_RSA_RNG_FAILED + ret );

            p++;
        }
    }
    else
    {
        *p++ = MBEDTLS_RSA_SIGN;

        while( nb_pad-- > 0 )
            *p++ = 0xFF;
    }

    *p++ = 0;
    memcpy( p, input, ilen );

    return( ( mode == MBEDTLS_RSA_PUBLIC )
            ? mbedtls_rsa_public(  ctx, output, output )
            : mbedtls_rsa_private( ctx, f_rng, p_rng, output, output ) );
}